

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::RecyclableMethodsGroupDisplay::RecyclableMethodsGroupDisplay
          (RecyclableMethodsGroupDisplay *this,RecyclableMethodsGroupWalker *_methodGroupWalker,
          ResolvedObject *resolvedObject)

{
  ResolvedObject *resolvedObject_local;
  RecyclableMethodsGroupWalker *_methodGroupWalker_local;
  RecyclableMethodsGroupDisplay *this_local;
  
  RecyclableObjectDisplay::RecyclableObjectDisplay
            (&this->super_RecyclableObjectDisplay,resolvedObject,0);
  (this->super_RecyclableObjectDisplay).super_IDiagObjectModelDisplay._vptr_IDiagObjectModelDisplay
       = (_func_int **)&PTR_Name_01deb160;
  this->methodGroupWalker = _methodGroupWalker;
  return;
}

Assistant:

RecyclableMethodsGroupDisplay::RecyclableMethodsGroupDisplay(RecyclableMethodsGroupWalker *_methodGroupWalker, ResolvedObject* resolvedObject)
        : methodGroupWalker(_methodGroupWalker),
          RecyclableObjectDisplay(resolvedObject)
    {
    }